

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                   *this,Index currentIndex)

{
  Index *pIVar1;
  uint uVar2;
  Index source;
  node_ptr plVar3;
  pointer puVar4;
  pointer p_1;
  pointer pIVar5;
  ulong uVar6;
  undefined1 *puVar7;
  pointer p;
  anon_class_8_1_8991fb9c get_column_with_pivot_;
  Column *curr;
  Column_support *pCVar8;
  initializer_list<unsigned_int> local_40;
  Index local_2c;
  
  local_40._M_array = &local_2c;
  local_40._M_len = 1;
  uVar2 = (this->mirrorMatrixU_).nextInsertIndex_;
  uVar6 = ((long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mirrorMatrixU_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_2c = currentIndex;
  if (uVar6 < uVar2 || uVar6 - uVar2 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
    ::resize(&(this->mirrorMatrixU_).matrix_,(ulong)(uVar2 + 1));
  }
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
  ::_container_insert<std::initializer_list<unsigned_int>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
              *)&this->mirrorMatrixU_,&local_40,uVar2,0);
  pIVar1 = &(this->mirrorMatrixU_).nextInsertIndex_;
  *pIVar1 = *pIVar1 + 1;
  pIVar5 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(undefined1 **)&pIVar5[currentIndex].column_.super_type.data_;
  if ((Column_support *)puVar7 != &pIVar5[currentIndex].column_ && puVar7 != (undefined1 *)0x0) {
    plVar3 = *(node_ptr *)((long)&pIVar5[currentIndex].column_.super_type + 8);
    if (plVar3 == (node_ptr)0x0) goto LAB_00140cd5;
    uVar2 = *(uint *)&plVar3[1].next_;
    if (((ulong)uVar2 != 0xffffffff) &&
       ((ulong)((long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar2)) {
      local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->pivotToColumnIndex_,(ulong)(uVar2 * 2 + 2),(value_type_conflict *)&local_40)
      ;
      pIVar5 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(undefined1 **)&pIVar5[currentIndex].column_.super_type;
    }
  }
  if ((puVar7 != (undefined1 *)0x0) &&
     (pCVar8 = &pIVar5[currentIndex].column_, (Column_support *)puVar7 != pCVar8)) {
    plVar3 = *(node_ptr *)((long)&pIVar5[currentIndex].column_.super_type + 8);
    if (plVar3 == (node_ptr)0x0) {
LAB_00140cd5:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar6 = (ulong)*(uint *)&plVar3[1].next_;
    if (uVar6 != 0xffffffff) {
      puVar4 = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      source = puVar4[uVar6];
      while (source != 0xffffffff) {
        _reduce_column_by(this,currentIndex,source);
        puVar7 = *(undefined1 **)&(pCVar8->super_type).data_;
        if ((puVar7 == (undefined1 *)0x0) || ((Column_support *)puVar7 == pCVar8))
        goto LAB_00140cc2;
        plVar3 = *(node_ptr *)((long)&pIVar5[currentIndex].column_.super_type + 8);
        if (plVar3 == (node_ptr)0x0) goto LAB_00140cd5;
        uVar6 = (ulong)*(uint *)&plVar3[1].next_;
        if (uVar6 == 0xffffffff) goto LAB_00140cc2;
        puVar4 = (this->pivotToColumnIndex_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        source = puVar4[uVar6];
      }
      puVar4[uVar6] = currentIndex;
    }
  }
LAB_00140cc2:
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}